

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformEdgeSampleCollection.h
# Opt level: O3

OrderedEdgeCollection *
GetEdgesByUniSampling(OrderedEdgeCollection *__return_storage_ptr__,CGraph *cg,long params)

{
  ulong *puVar1;
  size_type __n;
  size_type __n_00;
  long lVar2;
  EdgeIdx *pEVar3;
  void *pvVar4;
  EdgeIdx *pEVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  uniform_int_distribution<long> unif_rand_edge;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> local_e8;
  OrderedEdge local_c8;
  vector<bool,_std::allocator<bool>_> local_a8;
  vector<bool,_std::allocator<bool>_> local_80;
  OrderedEdgeCollection *local_58;
  ulong local_50;
  size_type local_48;
  uniform_int_distribution<long> local_40;
  
  __n = cg->nVertices;
  __n_00 = cg->nEdges;
  lVar2 = *(long *)(params + 0x40);
  local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (OrderedEdge *)0x0;
  local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (OrderedEdge *)0x0;
  local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_80,__n_00,(bool *)&local_a8,(allocator_type *)&local_c8);
  local_c8.u = local_c8.u & 0xffffffffffffff00;
  local_48 = __n;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_a8,__n,(bool *)&local_c8,(allocator_type *)&local_40);
  local_40._M_param._M_b = __n_00 - 1;
  local_40._M_param._M_a = 0;
  if (lVar2 < 1) {
    lVar11 = 0;
  }
  else {
    lVar12 = 0;
    local_50 = 0x800000000000003f;
    local_58 = __return_storage_ptr__;
    do {
      uVar6 = std::uniform_int_distribution<long>::operator()
                        (&local_40,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&stack0x00000008,&local_40._M_param);
      pEVar3 = cg->offsets;
      uVar9 = local_48;
      while (pEVar5 = pEVar3, 0 < (long)uVar9) {
        uVar10 = uVar9 >> 1;
        pEVar3 = pEVar5 + uVar10 + 1;
        uVar9 = ~uVar10 + uVar9;
        if ((long)uVar6 < (pEVar5 + uVar10 + 1)[-1]) {
          pEVar3 = pEVar5;
          uVar9 = uVar10;
        }
      }
      uVar10 = cg->nbors[uVar6];
      lVar11 = (long)pEVar5 - (long)cg->offsets >> 3;
      uVar9 = lVar11 - 1;
      uVar7 = Escape::CGraph::getEdgeBinary(cg,uVar9,uVar10);
      if (uVar7 != uVar6) {
        puts("Bug in the code!! Run!!!! \n");
      }
      pEVar3 = cg->offsets;
      local_c8.degree = pEVar3[uVar10 + 1] - pEVar3[uVar10];
      lVar8 = pEVar3[lVar11] - pEVar3[lVar11 + -1];
      local_c8.u = uVar10;
      local_c8.v = uVar9;
      if ((lVar8 <= local_c8.degree) &&
         ((local_c8.degree != lVar8 || ((long)uVar9 <= (long)uVar10)))) {
        local_c8.degree = lVar8;
        local_c8.u = uVar9;
        local_c8.v = uVar10;
      }
      local_c8.index = uVar6;
      if (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
                  (&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_c8);
      }
      else {
        (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->index = uVar6;
        (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->degree = local_c8.degree;
        (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->u = local_c8.u;
        (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->v = local_c8.v;
        local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      lVar12 = lVar12 + 1;
      uVar7 = uVar6 + 0x3f;
      if (-1 < (long)uVar6) {
        uVar7 = uVar6;
      }
      local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p
      [((long)uVar7 >> 6) + ((ulong)((uVar6 & local_50) < 0x8000000000000001) - 1)] =
           local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + ((ulong)((uVar6 & local_50) < 0x8000000000000001) - 1)] |
           1L << ((byte)uVar6 & 0x3f);
      uVar6 = lVar11 + 0x3e;
      if (-1 < (long)uVar9) {
        uVar6 = uVar9;
      }
      puVar1 = (ulong *)(CONCAT71(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                  _1_7_,local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p._0_1_) + ((long)uVar6 >> 6) * 8 + -8 +
                        (ulong)((uVar9 & local_50) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)uVar9 & 0x3f);
      uVar9 = uVar10 + 0x3f;
      if (-1 < (long)uVar10) {
        uVar9 = uVar10;
      }
      puVar1 = (ulong *)(CONCAT71(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                  _1_7_,local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p._0_1_) + ((long)uVar9 >> 6) * 8 + -8 +
                        (ulong)((uVar10 & local_50) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)uVar10 & 0x3f);
      lVar11 = lVar2;
      __return_storage_ptr__ = local_58;
    } while (lVar12 != lVar2);
  }
  __return_storage_ptr__->no_of_edges = lVar2;
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
            (&__return_storage_ptr__->edge_list,&local_e8);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&__return_storage_ptr__->visited_edge_set,&local_80);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&__return_storage_ptr__->visited_vertex_set,&local_a8);
  __return_storage_ptr__->no_of_query = lVar11;
  pvVar4 = (void *)CONCAT71(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                            local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

OrderedEdgeCollection GetEdgesByUniSampling(CGraph *cg, const Parameters &params, std::mt19937 mt) {
    /**
      * Setting of various input parameters for executing the algorithm
    */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges;
    VertexIdx seed_count = params.seed_count;
    EdgeIdx walk_length = params.walk_length;

    /**
     * Data structures for book-keeping and local variables
    */
    std::vector<OrderedEdge> edge_list;
    std::vector<bool> visited_edge_set (m,false);
    std::vector<bool> visited_vertex_set (n,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    VertexIdx src = 0, dst = 0;
    EdgeIdx nEdges = 0;
    /**
       * Set up random number generator
    */
    std::uniform_int_distribution<EdgeIdx> unif_rand_edge(0, m - 1);

    /**
     * Sample uniform random edges and store them in the structure
     */
    for (EdgeIdx i = 0; i < walk_length ; i++) {
        EdgeIdx e = unif_rand_edge(mt);
        dst = cg->nbors[e];
        no_of_query++; // One query to the uniform random neighbor oracle
        // binary search the array cg->offset to find the index v, such that edges[e] lies between cg->offset[v]
        // and cg->offset[v+1]. We achieve this by calling std::upper_bound
        src = std::upper_bound (cg->offsets, cg->offsets+n, e) - cg->offsets -1;

        // sanity check: the edge {src,dst} must have index edges[e].
        if (cg->getEdgeBinary(src,dst) != e)
            printf("Bug in the code!! Run!!!! \n\n");

        /**
          * Update the edge collection data structure with relevant information about the edge
         */
        VertexIdx u, v, low_deg;
        if (cg->degree(dst) < cg->degree(src) || (cg->degree(dst) == cg->degree(src) && dst < src)) {
            u = dst;
            v = src;
            low_deg = cg->degree(dst);
        } else {
            u = src;
            v = dst;
            low_deg = cg->degree(src);
        }
        edge_list.push_back(OrderedEdge{u, v, e, low_deg});

        /**
         * Update the book-keeping data structure with the visited edge and vertices
         */
        visited_edge_set[e] = true;
        visited_vertex_set[src] = true;
        visited_vertex_set[dst] = true;
    }

    OrderedEdgeCollection returnEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set, no_of_query};
    return returnEdgeCollection;
}